

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O3

void calculate_volumes(space_source *source,space_mixer_data *data)

{
  uint uVar1;
  mixed_channel_t c;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  mixed_channel_t speaker_count;
  mixed_channel_t speakers [33];
  float volumes [33];
  byte local_121;
  float local_120;
  float fStack_11c;
  float local_118;
  float local_110;
  float local_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  byte local_d8 [48];
  float local_a8 [36];
  
  local_10c = source->min_distance;
  fVar6 = source->max_distance;
  fVar8 = source->location[0] - data->location[0];
  fVar9 = source->location[1] - data->location[1];
  fVar7 = source->location[2] - data->location[2];
  local_110 = SQRT(fVar7 * fVar7 + fVar8 * fVar8 + fVar9 * fVar9);
  if (fVar6 <= local_110) {
    local_110 = fVar6;
  }
  fVar5 = 1.0;
  if ((local_10c < local_110) && (local_10c < fVar6)) {
    local_108 = ZEXT416((uint)fVar7);
    local_e8 = ZEXT416((uint)fVar8);
    local_f8 = ZEXT416((uint)fVar9);
    fVar5 = (*data->attenuation)(local_10c,fVar6,local_110,source->rolloff);
    fVar7 = (float)local_108._0_4_;
    fVar8 = (float)local_e8._0_4_;
    fVar9 = (float)local_f8._0_4_;
  }
  local_108._0_4_ = fVar5;
  if (source->spatial == true) {
    local_120 = data->look_at[2] * fVar7 + fVar8 * data->look_at[0] + data->look_at[1] * fVar9;
    fStack_11c = data->look_at[5] * fVar7 + fVar8 * data->look_at[3] + data->look_at[4] * fVar9;
    local_118 = fVar7 * data->look_at[8] + fVar8 * data->look_at[6] + fVar9 * data->look_at[7];
    if (local_110 < local_10c) {
      fVar7 = 1.0 - local_110 / local_10c;
      fVar7 = fVar7 + fVar7;
      fVar6 = 1.0;
      if (fVar7 <= 1.0) {
        fVar6 = fVar7;
      }
      fVar7 = 1.0 - fVar6;
      local_120 = local_120 * fVar7 + fVar6 * 0.0;
      fStack_11c = fStack_11c * fVar7 + fVar6 * 0.0;
      local_118 = local_118 * fVar7 + fVar6;
    }
    mixed_compute_gains_resolver(&local_120,local_a8,local_d8,&local_121,&data->vbap);
    uVar3 = (ulong)local_121;
    uVar1 = (uint)local_121;
    if (uVar3 != 0) {
      uVar2 = 0;
      do {
        fVar6 = 1.0;
        if (local_a8[uVar2] * (float)local_108._0_4_ <= 1.0) {
          fVar6 = local_a8[uVar2] * (float)local_108._0_4_;
        }
        local_a8[uVar2] = fVar6;
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
    }
    if ((local_10c < local_110) && (data->surround == false)) {
      fVar6 = SQRT(local_118 * local_118 + local_120 * local_120 + fStack_11c * fStack_11c);
      if (0.0 < fVar6) {
        fVar7 = local_120 / fVar6;
      }
      else {
        fVar7 = 0.0;
      }
      if (0.0 < fVar6) {
        fVar8 = (fStack_11c / fVar6) * 0.0;
      }
      else {
        fVar8 = 0.0;
      }
      if (local_121 != 0 &&
          (float)(-(uint)(0.0 < fVar6) & (uint)(local_118 / fVar6)) + fVar7 * 0.0 + fVar8 < 0.0) {
        uVar2 = 0;
        do {
          uVar4 = (ulong)(data->channels).positions[local_d8[uVar2]];
          if ((uVar4 < 0x21) && ((0x122020202U >> (uVar4 & 0x3f) & 1) != 0)) {
            local_a8[uVar2] = -local_a8[uVar2];
          }
          uVar2 = uVar2 + 1;
        } while (uVar3 != uVar2);
      }
    }
  }
  else {
    local_120 = 0.0;
    fStack_11c = 0.0;
    local_118 = 0.0;
    mixed_compute_gains_resolver(&local_120,local_a8,local_d8,&local_121,&data->vbap);
    uVar1 = (uint)local_121;
    if ((ulong)local_121 == 0) {
      uVar1 = 0;
    }
    else {
      uVar3 = 0;
      do {
        fVar6 = 1.0;
        if (local_a8[uVar3] * (float)local_108._0_4_ <= 1.0) {
          fVar6 = local_a8[uVar3] * (float)local_108._0_4_;
        }
        local_a8[uVar3] = fVar6;
        uVar3 = uVar3 + 1;
      } while (local_121 != uVar3);
    }
  }
  memcpy(source->volumes,local_a8,(ulong)(uVar1 * 4));
  memcpy(source->speakers,local_d8,(ulong)(uVar1 * 4));
  source->speaker_count = (mixed_channel_t)uVar1;
  return;
}

Assistant:

VECTORIZE static void calculate_volumes(struct space_source *source, struct space_mixer_data *data){
  float volumes[MIXED_MAX_SPEAKER_COUNT];
  mixed_channel_t speakers[MIXED_MAX_SPEAKER_COUNT];
  mixed_channel_t speaker_count;
  float forward[3] = {0.0, 0.0, 1.0};
  float min = source->min_distance;
  float max = source->max_distance;
  float roll = source->rolloff;
  // Relative location to our listener
  float location[3] = {source->location[0]-data->location[0],
                       source->location[1]-data->location[1],
                       source->location[2]-data->location[2]};
  float distance = MIN(vec_length(location), max);
  float volume = 1.0;
  if(min < distance && min < max){
    volume *= data->attenuation(min, max, distance, roll);
  }
  if(source->spatial){
    // Bring the location into our reference frame
    vec_mul(location, data->look_at, location);
    // If we are below min distance, bend towards forward
    if(distance < min){
      vec_lerp(location, location, forward, MIN(1.0, (1-distance/min)*2));
    }
    // Compute the actual gain factors using VBAP
    mixed_compute_gains(location, volumes, speakers, &speaker_count, &data->vbap);
    for(mixed_channel_t c=0; c<speaker_count; ++c){
      volumes[c] = MIN(1.0, volume*volumes[c]);
    }
    // If we are not on a surround setup, we can simulate the sound appearing
    // from behind by inverting the right channels, causing a phase shift.
    // Only do this when the sound is far enough away though as otherwise it
    // can lead to frequent fluctuations, which sound very... bad.
    if(!data->surround && min < distance && calculate_phase(location) < 0){
      for(mixed_channel_t c=0; c<speaker_count; ++c){
        switch(data->channels.positions[speakers[c]]){
        case MIXED_RIGHT_FRONT_BOTTOM:
        case MIXED_RIGHT_FRONT_TOP:
        case MIXED_RIGHT_FRONT_WIDE:
        case MIXED_RIGHT_FRONT_HIGH:
        case MIXED_RIGHT_CENTER_BOTTOM:
        case MIXED_RIGHT_FRONT_CENTER_BOTTOM:
          volumes[c] *= -1.0;
        }
      }
    }
  }else{
    location[0] = 0.0;
    location[1] = 0.0;
    location[2] = 0.0;
    mixed_compute_gains(location, volumes, speakers, &speaker_count, &data->vbap);
    for(mixed_channel_t c=0; c<speaker_count; ++c){
      volumes[c] = MIN(1.0, volume*volumes[c]);
    }
  }
  // Cache
  memcpy(source->volumes, volumes, sizeof(float)*speaker_count);
  memcpy(source->speakers, speakers, sizeof(float)*speaker_count);
  source->speaker_count = speaker_count;
}